

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86.cpp
# Opt level: O0

int __thiscall ncnn::InnerProduct_x86::create_pipeline_int8_x86(InnerProduct_x86 *this,Option *opt)

{
  int *piVar1;
  int iVar2;
  undefined8 *puVar3;
  Mat *in_RSI;
  long in_RDI;
  float scale_in;
  int p_1;
  int j;
  int p;
  char *g0;
  int q;
  Mat weight_data_r2;
  int out_elempack;
  int num_input;
  Allocator *in_stack_fffffffffffffe98;
  Allocator *in_stack_fffffffffffffea0;
  undefined1 *in_stack_fffffffffffffea8;
  int _w;
  Mat *this_00;
  undefined4 in_stack_fffffffffffffec0;
  float fVar4;
  undefined4 in_stack_fffffffffffffec4;
  int local_138;
  int local_134;
  undefined1 *local_130;
  int local_128;
  void *local_118;
  int *local_110;
  long local_108;
  long *local_f8;
  int local_ec;
  Allocator *in_stack_ffffffffffffff28;
  int _h;
  
  iVar2 = *(int *)(in_RDI + 0xd8) / *(int *)(in_RDI + 0xd0);
  _h = 1;
  if ((((ulong)in_RSI->allocator & 0x100000000000000) != 0) &&
     (_h = 1, *(int *)(in_RDI + 0xd0) % 8 == 0)) {
    _h = 8;
  }
  this_00 = (Mat *)0x0;
  Mat::reshape(in_RSI,iVar2,_h,in_stack_ffffffffffffff28);
  Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
              (int)((ulong)in_RDI >> 0x20),(int)in_RDI,(size_t)this_00,
              (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),in_stack_fffffffffffffea0);
  for (local_128 = 0; _w = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
      local_128 + _h + -1 < *(int *)(in_RDI + 0xd0); local_128 = _h + local_128) {
    in_stack_fffffffffffffea8 =
         (undefined1 *)
         (*(long *)(in_RDI + 600) +
         (long)*(int *)(in_RDI + 0x284) * (long)(local_128 / _h) * *(long *)(in_RDI + 0x268));
    local_130 = in_stack_fffffffffffffea8;
    for (local_134 = 0; local_134 < iVar2; local_134 = local_134 + 1) {
      for (local_138 = 0; local_138 < _h; local_138 = local_138 + 1) {
        in_stack_fffffffffffffea0 =
             (Allocator *)
             ((long)local_118 + (long)local_ec * (long)(local_128 + local_138) * local_108);
        *local_130 = *(undefined1 *)
                      ((long)&in_stack_fffffffffffffea0->_vptr_Allocator + (long)local_134);
        local_130 = local_130 + 1;
      }
    }
  }
  if (local_110 != (int *)0x0) {
    LOCK();
    iVar2 = *local_110;
    *local_110 = *local_110 + -1;
    UNLOCK();
    if (iVar2 == 1) {
      if (local_f8 == (long *)0x0) {
        if (local_118 != (void *)0x0) {
          free(local_118);
        }
      }
      else {
        (**(code **)(*local_f8 + 0x18))(local_f8,local_118);
      }
    }
  }
  Mat::create(this_00,_w,(size_t)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  for (iVar2 = 0; iVar2 < *(int *)(in_RDI + 0xd0); iVar2 = iVar2 + 1) {
    fVar4 = *(float *)(*(long *)(in_RDI + 0x1c0) + (long)iVar2 * 4);
    if ((fVar4 != 0.0) || (NAN(fVar4))) {
      fVar4 = 1.0 / (**(float **)(in_RDI + 0x208) *
                    *(float *)(*(long *)(in_RDI + 0x1c0) + (long)iVar2 * 4));
    }
    else {
      fVar4 = 0.0;
    }
    *(float *)(*(long *)(in_RDI + 0x2a0) + (long)iVar2 * 4) = fVar4;
  }
  if (((ulong)in_RSI->data & 1) != 0) {
    puVar3 = (undefined8 *)(in_RDI + 0x130);
    if (*(long *)(in_RDI + 0x138) != 0) {
      piVar1 = *(int **)(in_RDI + 0x138);
      LOCK();
      iVar2 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (iVar2 == 1) {
        if (*(long *)(in_RDI + 0x150) == 0) {
          if ((void *)*puVar3 != (void *)0x0) {
            free((void *)*puVar3);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x150) + 0x18))(*(long **)(in_RDI + 0x150),*puVar3);
        }
      }
    }
    *puVar3 = 0;
    *(undefined8 *)(in_RDI + 0x140) = 0;
    *(undefined4 *)(in_RDI + 0x148) = 0;
    *(undefined4 *)(in_RDI + 0x158) = 0;
    *(undefined4 *)(in_RDI + 0x15c) = 0;
    *(undefined4 *)(in_RDI + 0x160) = 0;
    *(undefined4 *)(in_RDI + 0x164) = 0;
    *(undefined4 *)(in_RDI + 0x168) = 0;
    *(undefined8 *)(in_RDI + 0x170) = 0;
    *(undefined8 *)(in_RDI + 0x138) = 0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86::create_pipeline_int8_x86(const Option& opt)
{
    const int num_input = weight_data_size / num_output;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack = num_output % 8 == 0 ? 8 : 1;
    }
#endif // __SSE2__

    // src = inch-outch
    // dst = pb-inch-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

        weight_data_tm.create(num_input, num_output / out_elempack, (size_t)out_elempack, out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            signed char* g0 = weight_data_tm.row<signed char>(q / out_elempack);

            for (int p = 0; p < num_input; p++)
            {
                for (int j = 0; j < out_elempack; j++)
                {
                    *g0++ = weight_data_r2.row<signed char>(q + j)[p];
                }
            }
        }
    }

    scale_in_data.create(num_output);
    for (int p = 0; p < num_output; p++)
    {
        // dequantize
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        scale_in_data[p] = scale_in;
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}